

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseStringProperty
               (string *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  bool bVar1;
  char *member;
  ulong uVar2;
  json *o_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [8];
  string strValue;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  json_const_iterator it;
  string *parent_node_local;
  bool required_local;
  string *property_local;
  json *o_local;
  string *err_local;
  string *ret_local;
  
  it.m_it.primitive_iterator.m_it = (difference_type)parent_node;
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)local_60);
  member = (char *)std::__cxx11::string::c_str();
  bVar1 = anon_unknown_57::FindMember(o,member,(json_const_iterator *)local_60);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_110);
    o_00 = anon_unknown_57::GetValue((json_const_iterator *)local_60);
    bVar1 = anon_unknown_57::GetString(o_00,(string *)local_110);
    if (bVar1) {
      if (ret != (string *)0x0) {
        std::__cxx11::string::operator=((string *)ret,(string *)local_110);
      }
      ret_local._7_1_ = true;
    }
    else {
      if ((required) && (err != (string *)0x0)) {
        std::operator+(&local_150,"\'",property);
        std::operator+(&local_130,&local_150,"\' property is not a string type.\n");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
      }
      ret_local._7_1_ = false;
    }
    std::__cxx11::string::~string((string *)local_110);
  }
  else {
    if ((required) && (err != (string *)0x0)) {
      std::operator+(&local_a0,"\'",property);
      std::operator+(&local_80,&local_a0,"\' property is missing");
      std::__cxx11::string::operator+=((string *)err,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&strValue.field_2 + 8);
        std::operator+(__return_storage_ptr__," in `",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       it.m_it.primitive_iterator.m_it);
        std::operator+(&local_d0,__return_storage_ptr__,"\'.\n");
        std::__cxx11::string::operator+=((string *)err,(string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)(strValue.field_2._M_local_buf + 8));
      }
      else {
        std::__cxx11::string::operator+=((string *)err,".\n");
      }
    }
    ret_local._7_1_ = false;
  }
  return ret_local._7_1_;
}

Assistant:

static bool ParseStringProperty(
    std::string *ret, std::string *err, const json &o,
    const std::string &property, bool required,
    const std::string &parent_node = std::string()) {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (parent_node.empty()) {
          (*err) += ".\n";
        } else {
          (*err) += " in `" + parent_node + "'.\n";
        }
      }
    }
    return false;
  }

  std::string strValue;
  if (!GetString(GetValue(it), strValue)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a string type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = std::move(strValue);
  }

  return true;
}